

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# error_info_impl.hpp
# Opt level: O0

string * toml::format_error_abi_cxx11_(error_info *err)

{
  void *this;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  ostream *this_01;
  string *in_RDI;
  ostringstream oss;
  error_info *in_stack_00000100;
  string *in_stack_00000108;
  ostringstream local_188 [392];
  
  std::__cxx11::ostringstream::ostringstream(local_188);
  this = (void *)std::ostream::operator<<(local_188,color::ansi::red);
  this_00 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
            std::ostream::operator<<(this,color::ansi::bold);
  this_01 = std::operator<<((ostream *)this_00,"[error]");
  std::ostream::operator<<(this_01,color::ansi::reset);
  std::__cxx11::ostringstream::str();
  format_error(in_stack_00000108,in_stack_00000100);
  std::__cxx11::string::~string(this_00);
  std::__cxx11::ostringstream::~ostringstream(local_188);
  return in_RDI;
}

Assistant:

TOML11_INLINE std::string format_error(const error_info& err)
{
    std::ostringstream oss;
    oss << color::red << color::bold << "[error]" << color::reset;
    return format_error(oss.str(), err);
}